

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AdvancedSharedIndexing::Run(AdvancedSharedIndexing *this)

{
  allocator<tcu::Vector<float,_4>_> *this_00;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  GLuint GVar6;
  GLint GVar7;
  reference pixels;
  reference pixels_00;
  byte *pbVar8;
  reference pvVar9;
  size_type sVar10;
  CallLogWrapper *this_01;
  Vector<float,_4> local_130;
  Vector<float,_4> local_120;
  ulong local_110;
  size_t i_1;
  float local_100 [2];
  int local_f8;
  allocator<unsigned_char> local_f1;
  int i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> colorData;
  undefined1 local_d0 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data_1;
  GLfloat values [16];
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> data;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  AdvancedSharedIndexing *this_local;
  
  local_20 = 
  "\nlayout(binding = 3, rgba8) uniform mediump writeonly image2D g_result_image;\nlayout (local_size_x = 4,local_size_y=4 ) in;\nshared vec4 g_shared1[4];\nshared mat4 g_shared2;\nshared struct {\n  float data[4];\n} g_shared3[4];\nshared struct Type { float data[4]; } g_shared4[4];\nshared Type g_shared5[4];\nuniform bool g_true;\nuniform float g_values[16];\n\nvoid Sync() {\n  groupMemoryBarrier();\n  barrier();\n}\nvoid SetMemory(ivec2 xy, float value) {\n  g_shared1[xy.y][gl_LocalInvocationID.x] = value;\n  g_shared2[xy.y][xy.x] = value;\n  g_shared3[xy[1]].data[xy[0]] = value;\n  g_shared4[xy.y].data[xy[0]] = value;\n  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;\n}\nbool CheckMemory(ivec2 xy, float expected) {\n  if (g_shared1[xy.y][xy[0]] != expected) return false;\n  if (g_shared2[xy[1]][xy[0]] != expected) return false;\n  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;\n  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;\n  if (g_shared5[xy.y].data[xy.x] != expected) return false;\n  return true;\n}\nvoid main() {\n  ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  vec4 result = vec4(0.0, 1.0, 0.0, 1.0);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n\n  if (g_true && gl_LocalInvocationID.x < 10u) {\n    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);\n    Sync();\n    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n  }\n\n  imageStore(g_result_image, thread_xy, result);\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(binding = 3, rgba8) uniform mediump writeonly image2D g_result_image;\nlayout (local_size_x = 4,local_size_y=4 ) in;\nshared vec4 g_shared1[4];\nshared mat4 g_shared2;\nshared struct {\n  float data[4];\n} g_shared3[4];\nshared struct Type { float data[4]; } g_shared4[4];\nshared Type g_shared5[4];\nuniform bool g_true;\nuniform float g_values[16];\n\nvoid Sync() {\n  groupMemoryBarrier();\n  barrier();\n}\nvoid SetMemory(ivec2 xy, float value) {\n  g_shared1[xy.y][gl_LocalInvocationID.x] = value;\n  g_shared2[xy.y][xy.x] = value;\n  g_shared3[xy[1]].data[xy[0]] = value;\n  g_shared4[xy.y].data[xy[0]] = value;\n  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;\n}\nbool CheckMemory(ivec2 xy, float expected) {\n  if (g_shared1[xy.y][xy[0]] != expected) return false;\n  if (g_shared2[xy[1]][xy[0]] != expected) return false;\n  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;\n  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;\n  if (g_shared5[xy.y].data[xy.x] != expected) return false;\n  return true;\n}\nvoid main() {\n  ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  vec4 result = vec4(0.0, 1.0, 0.0, 1.0);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n\n  if (g_true && gl_LocalInvocationID.x < 10u) {\n    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);\n    Sync();\n    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n  }\n\n  imageStore(g_result_image, thread_xy, result);\n}"
             ,&local_41);
  GVar6 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar6;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar5 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar5) {
    std::allocator<int>::allocator((allocator<int> *)((long)values + 0x3f));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_70,0x40,
               (allocator<int> *)((long)values + 0x3f));
    std::allocator<int>::~allocator((allocator<int> *)((long)values + 0x3f));
    glu::CallLogWrapper::glGenTextures
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_texture);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2801,0x2601);
    glu::CallLogWrapper::glTexStorage2D
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,1,0x8058,4,4);
    pixels = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_70,0);
    glu::CallLogWrapper::glTexSubImage2D
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0,0,0,4,4,0x1908,0x1401,pixels);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
    this_01 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glBindImageTexture(this_01,3,this->m_texture,0,'\0',0,0x88b9,0x8058);
    glu::CallLogWrapper::glUseProgram(this_01,this->m_program);
    GVar7 = glu::CallLogWrapper::glGetUniformLocation(this_01,this->m_program,"g_true");
    glu::CallLogWrapper::glUniform1i(this_01,GVar7,1);
    values[10] = 13.0;
    values[0xb] = 14.0;
    values[0xc] = 15.0;
    values[0xd] = 16.0;
    values[6] = 9.0;
    values[7] = 10.0;
    values[8] = 11.0;
    values[9] = 12.0;
    values[2] = 5.0;
    values[3] = 6.0;
    values[4] = 7.0;
    values[5] = 8.0;
    data_1.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x400000003f800000;
    values[0] = 3.0;
    values[1] = 4.0;
    GVar7 = glu::CallLogWrapper::glGetUniformLocation(this_01,this->m_program,"g_values");
    glu::CallLogWrapper::glUniform1fv
              (this_01,GVar7,0x10,
               (GLfloat *)
               &data_1.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    glu::CallLogWrapper::glDispatchCompute(this_01,1,1,1);
    this_00 = (allocator<tcu::Vector<float,_4>_> *)
              ((long)&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(this_00);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_d0,
               0x10,this_00);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x100);
    glu::CallLogWrapper::glGenFramebuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_fbo);
    glu::CallLogWrapper::glBindFramebuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8d40,this->m_fbo);
    glu::CallLogWrapper::glFramebufferTexture2D
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8d40,0x8ce0,0xde1,this->m_texture,0);
    std::allocator<unsigned_char>::allocator(&local_f1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,0x40,&local_f1);
    std::allocator<unsigned_char>::~allocator(&local_f1);
    pixels_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,0);
    glu::CallLogWrapper::glReadPixels
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,4,4,0x1908,0x1401,pixels_00);
    for (local_f8 = 0; local_f8 < 0x40; local_f8 = local_f8 + 4) {
      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,(long)local_f8
                         );
      bVar1 = *pbVar8;
      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                          (long)(local_f8 + 1));
      bVar2 = *pbVar8;
      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                          (long)(local_f8 + 2));
      bVar3 = *pbVar8;
      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                          (long)(local_f8 + 3));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)&i_1,(float)bVar1 / 255.0,(float)bVar2 / 255.0,
                 (float)bVar3 / 255.0,(float)*pbVar8 / 255.0);
      pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_d0,(long)(local_f8 / 4));
      *(size_t *)pvVar9->m_data = i_1;
      *(float (*) [2])(pvVar9->m_data + 2) = local_100;
    }
    for (local_110 = 0; uVar4 = local_110,
        sVar10 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                           ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_d0), uVar4 < sVar10; local_110 = local_110 + 1) {
      pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_d0,local_110);
      tcu::Vector<float,_4>::Vector(&local_120,pvVar9);
      tcu::Vector<float,_4>::Vector(&local_130,0.0,1.0,0.0,1.0);
      bVar5 = ComputeShaderBase::IsEqual(&this->super_ComputeShaderBase,&local_120,&local_130);
      if (!bVar5) {
        anon_unknown_0::Output("Invalid data at index %d.\n",local_110);
        this_local = (AdvancedSharedIndexing *)&DAT_ffffffffffffffff;
        bVar5 = true;
        goto LAB_01432010;
      }
    }
    bVar5 = false;
LAB_01432010:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_d0);
    if (!bVar5) {
      this_local = (AdvancedSharedIndexing *)0x0;
    }
  }
  else {
    this_local = (AdvancedSharedIndexing *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(binding = 3, rgba8) uniform mediump writeonly image2D g_result_image;" NL
			   "layout (local_size_x = 4,local_size_y=4 ) in;" NL "shared vec4 g_shared1[4];" NL
			   "shared mat4 g_shared2;" NL "shared struct {" NL "  float data[4];" NL "} g_shared3[4];" NL
			   "shared struct Type { float data[4]; } g_shared4[4];" NL "shared Type g_shared5[4];" NL
			   "uniform bool g_true;" NL "uniform float g_values[16];" NL NL "void Sync() {" NL
			   "  groupMemoryBarrier();" NL "  barrier();" NL "}" NL "void SetMemory(ivec2 xy, float value) {" NL
			   "  g_shared1[xy.y][gl_LocalInvocationID.x] = value;" NL "  g_shared2[xy.y][xy.x] = value;" NL
			   "  g_shared3[xy[1]].data[xy[0]] = value;" NL "  g_shared4[xy.y].data[xy[0]] = value;" NL
			   "  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;" NL "}" NL
			   "bool CheckMemory(ivec2 xy, float expected) {" NL
			   "  if (g_shared1[xy.y][xy[0]] != expected) return false;" NL
			   "  if (g_shared2[xy[1]][xy[0]] != expected) return false;" NL
			   "  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;" NL
			   "  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;" NL
			   "  if (g_shared5[xy.y].data[xy.x] != expected) return false;" NL "  return true;" NL "}" NL
			   "void main() {" NL "  ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL
			   "  vec4 result = vec4(0.0, 1.0, 0.0, 1.0);" NL NL
			   "  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);" NL "  Sync();" NL
			   "  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1.0, 0.0, 0.0, "
			   "1.0);" NL NL "  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);" NL "  Sync();" NL
			   "  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1.0, 0.0, 0.0, "
			   "1.0);" NL NL "  if (g_true && gl_LocalInvocationID.x < 10u) {" NL
			   "    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);" NL "    Sync();" NL
			   "    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1.0, 0.0, 0.0, "
			   "1.0);" NL "  }" NL NL "  imageStore(g_result_image, thread_xy, result);" NL "}";

		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init texture */
		{
			std::vector<GLint> data(4 * 4 * 4);
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 4, 4);
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glBindImageTexture(3, m_texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA8);
		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_true"), GL_TRUE);
		GLfloat values[16] = { 1.f, 2.f, 3.f, 4.f, 5.f, 6.f, 7.f, 8.f, 9.f, 10.f, 11.f, 12.f, 13.f, 14.f, 15.f, 16.f };
		glUniform1fv(glGetUniformLocation(m_program, "g_values"), 16, values);
		glDispatchCompute(1, 1, 1);

		/* validate render target */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGenFramebuffers(1, &m_fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
			std::vector<GLubyte> colorData(4 * 4 * 4);
			glReadPixels(0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
			for (int i = 0; i < 4 * 4 * 4; i += 4)
			{
				data[i / 4] =
					vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
						 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
			}
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(0, 1, 0, 1)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}